

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QTimeZone *tz)

{
  QTimeZonePrivate *this;
  Data DVar1;
  QDebug *this_00;
  storage_type *in_RCX;
  ulong *in_RDX;
  char *t;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QArrayDataPointer<char> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)tz);
  *(undefined1 *)
   &(tz->d).d[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
  QDebug::operator<<((QDebug *)tz,"QTimeZone(");
  this = (QTimeZonePrivate *)*in_RDX;
  if (((ulong)this & 3) == 0) {
    if (this == (QTimeZonePrivate *)0x0) {
      local_58.size = 0;
      local_58.ptr = (char *)0x0;
    }
    else {
      QTimeZonePrivate::id((QByteArray *)&local_58,this);
    }
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)local_58.ptr;
    QString::fromUtf8((QString *)&local_40,(QString *)local_58.size,ba);
    QDebug::operator<<((QDebug *)tz,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (this != (QTimeZonePrivate *)0x0) {
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
  }
  else {
    t = "QTimeZone::UTC";
    switch((int)this - 1U & 3) {
    case 0:
      t = "QTimeZone::LocalTime";
    case 1:
      QDebug::operator<<((QDebug *)tz,t);
      break;
    case 2:
      this_00 = QDebug::operator<<((QDebug *)tz,"AheadOfUtcBy");
      QDebug::operator<<(this_00,(int)(*in_RDX >> 2));
    }
  }
  *(undefined1 *)
   &(tz->d).d[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
  QDebug::operator<<((QDebug *)tz,')');
  DVar1 = tz->d;
  (tz->d).d = (QTimeZonePrivate *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)DVar1;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QTimeZone &tz)
{
    QDebugStateSaver saver(dbg);
    const auto asIs = [](const char *text) { return text; };
    // TODO Include backend and data version details?
    dbg.nospace() << "QTimeZone(";
    tz.d.serialize(dbg, asIs);
    dbg.nospace() << ')';
    return dbg;
}